

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void replaceFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  char *__s2;
  void *__src;
  long lVar8;
  char *pcVar9;
  int iVar10;
  long nByte;
  char *local_78;
  
  pvVar7 = sqlite3ValueText(*argv,'\x01');
  if (pvVar7 != (void *)0x0) {
    iVar2 = sqlite3ValueBytes(*argv,'\x01');
    __s2 = (char *)sqlite3ValueText(argv[1],'\x01');
    if (__s2 != (char *)0x0) {
      if (*__s2 == '\0') {
        sqlite3VdbeMemCopy(context->pOut,*argv);
        return;
      }
      iVar3 = sqlite3ValueBytes(argv[1],'\x01');
      __src = sqlite3ValueText(argv[2],'\x01');
      if (__src != (void *)0x0) {
        iVar4 = sqlite3ValueBytes(argv[2],'\x01');
        nByte = (long)(iVar2 + 1);
        local_78 = (char *)contextMalloc(context,nByte);
        if (local_78 != (char *)0x0) {
          if (iVar2 - iVar3 < 0) {
            iVar6 = 0;
            iVar10 = 0;
          }
          else {
            iVar10 = 0;
            iVar6 = 0;
            do {
              cVar1 = *(char *)((long)pvVar7 + (long)iVar6);
              if ((cVar1 == *__s2) &&
                 (iVar5 = bcmp((void *)((long)iVar6 + (long)pvVar7),__s2,(long)iVar3), iVar5 == 0))
              {
                if ((long)context->pOut->db->aLimit[0] < (iVar4 - iVar3) + nByte + -1) {
                  context->isError = 0x12;
                  context->fErrorOrAux = '\x01';
                  sqlite3VdbeMemSetStr
                            (context->pOut,"string or blob too big",-1,'\x01',
                             (_func_void_void_ptr *)0x0);
                  goto LAB_00254fe1;
                }
                iVar5 = sqlite3_initialize();
                if (iVar5 == 0) {
                  nByte = nByte + (iVar4 - iVar3);
                  pcVar9 = (char *)sqlite3Realloc(local_78,(long)(int)nByte);
                  if (pcVar9 != (char *)0x0) {
                    memcpy(pcVar9 + iVar10,__src,(long)iVar4);
                    iVar10 = iVar10 + iVar4;
                    iVar5 = iVar6 + iVar3 + -1;
                    local_78 = pcVar9;
                    goto LAB_00254e92;
                  }
                }
                sqlite3_result_error_nomem(context);
LAB_00254fe1:
                sqlite3_free(local_78);
                return;
              }
              lVar8 = (long)iVar10;
              iVar10 = iVar10 + 1;
              local_78[lVar8] = cVar1;
              iVar5 = iVar6;
LAB_00254e92:
              iVar6 = iVar5 + 1;
            } while (iVar5 < iVar2 - iVar3);
          }
          memcpy(local_78 + iVar10,(void *)((long)pvVar7 + (long)iVar6),(long)(iVar2 - iVar6));
          iVar10 = (iVar2 - iVar6) + iVar10;
          local_78[iVar10] = '\0';
          setResultStrOrError(context,local_78,iVar10,'\x01',sqlite3_free);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void replaceFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zStr;        /* The input string A */
  const unsigned char *zPattern;    /* The pattern string B */
  const unsigned char *zRep;        /* The replacement string C */
  unsigned char *zOut;              /* The output */
  int nStr;                /* Size of zStr */
  int nPattern;            /* Size of zPattern */
  int nRep;                /* Size of zRep */
  i64 nOut;                /* Maximum size of zOut */
  int loopLimit;           /* Last zStr[] that might match zPattern[] */
  int i, j;                /* Loop counters */

  assert( argc==3 );
  UNUSED_PARAMETER(argc);
  zStr = sqlite3_value_text(argv[0]);
  if( zStr==0 ) return;
  nStr = sqlite3_value_bytes(argv[0]);
  assert( zStr==sqlite3_value_text(argv[0]) );  /* No encoding change */
  zPattern = sqlite3_value_text(argv[1]);
  if( zPattern==0 ){
    assert( sqlite3_value_type(argv[1])==SQLITE_NULL
            || sqlite3_context_db_handle(context)->mallocFailed );
    return;
  }
  if( zPattern[0]==0 ){
    assert( sqlite3_value_type(argv[1])!=SQLITE_NULL );
    sqlite3_result_value(context, argv[0]);
    return;
  }
  nPattern = sqlite3_value_bytes(argv[1]);
  assert( zPattern==sqlite3_value_text(argv[1]) );  /* No encoding change */
  zRep = sqlite3_value_text(argv[2]);
  if( zRep==0 ) return;
  nRep = sqlite3_value_bytes(argv[2]);
  assert( zRep==sqlite3_value_text(argv[2]) );
  nOut = nStr + 1;
  assert( nOut<SQLITE_MAX_LENGTH );
  zOut = contextMalloc(context, (i64)nOut);
  if( zOut==0 ){
    return;
  }
  loopLimit = nStr - nPattern;  
  for(i=j=0; i<=loopLimit; i++){
    if( zStr[i]!=zPattern[0] || memcmp(&zStr[i], zPattern, nPattern) ){
      zOut[j++] = zStr[i];
    }else{
      u8 *zOld;
      sqlite3 *db = sqlite3_context_db_handle(context);
      nOut += nRep - nPattern;
      testcase( nOut-1==db->aLimit[SQLITE_LIMIT_LENGTH] );
      testcase( nOut-2==db->aLimit[SQLITE_LIMIT_LENGTH] );
      if( nOut-1>db->aLimit[SQLITE_LIMIT_LENGTH] ){
        sqlite3_result_error_toobig(context);
        sqlite3_free(zOut);
        return;
      }
      zOld = zOut;
      zOut = sqlite3_realloc64(zOut, (int)nOut);
      if( zOut==0 ){
        sqlite3_result_error_nomem(context);
        sqlite3_free(zOld);
        return;
      }
      memcpy(&zOut[j], zRep, nRep);
      j += nRep;
      i += nPattern-1;
    }
  }
  assert( j+nStr-i+1==nOut );
  memcpy(&zOut[j], &zStr[i], nStr-i);
  j += nStr - i;
  assert( j<=nOut );
  zOut[j] = 0;
  sqlite3_result_text(context, (char*)zOut, j, sqlite3_free);
}